

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t FASTCOVER_buildDictionary
                 (FASTCOVER_ctx_t *ctx,U32 *freqs,void *dictBuffer,size_t dictBufferCapacity,
                 ZDICT_cover_params_t parameters,U16 *segmentFreqs)

{
  U16 *pUVar1;
  U32 f;
  uint uVar2;
  COVER_epoch_info_t CVar3;
  ulong uVar4;
  size_t sVar5;
  clock_t cVar6;
  ulong uVar7;
  ulong uVar8;
  U32 pos;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  size_t sVar14;
  uint local_b4;
  uint local_ac;
  
  CVar3 = COVER_computeEpochs((U32)dictBufferCapacity,(U32)ctx->nbDmers,parameters.k,1);
  if (1 < g_displayLevel) {
    fprintf(_stderr,"Breaking content into %u epochs of size %u\n",(ulong)CVar3 & 0xffffffff,
            (ulong)CVar3 >> 0x20);
    fflush(_stderr);
  }
  uVar8 = 0;
  uVar7 = 0;
  sVar14 = dictBufferCapacity;
  while (sVar14 != 0) {
    uVar9 = uVar8 * ((ulong)CVar3 >> 0x20);
    uVar11 = (uint)uVar9;
    uVar4 = (ulong)(CVar3.size + uVar11);
    f = ctx->f;
    uVar13 = uVar9 & 0xffffffff;
    uVar12 = 0;
    local_ac = 0;
    uVar2 = 0;
    local_b4 = 0;
    while( true ) {
      uVar11 = uVar11 + 1;
      uVar10 = uVar9 & 0xffffffff;
      if (uVar4 <= uVar13) break;
      sVar5 = FASTCOVER_hashPtrToIndex(ctx->samples + uVar13,f,parameters.d);
      if (segmentFreqs[sVar5] == 0) {
        uVar12 = uVar12 + freqs[sVar5];
      }
      segmentFreqs[sVar5] = segmentFreqs[sVar5] + 1;
      if (((parameters.d - parameters.k) + uVar11) - (int)uVar9 == 2) {
        sVar5 = FASTCOVER_hashPtrToIndex(ctx->samples + uVar10,f,parameters.d);
        pUVar1 = segmentFreqs + sVar5;
        *pUVar1 = *pUVar1 - 1;
        if (*pUVar1 == 0) {
          uVar12 = uVar12 - freqs[sVar5];
        }
        uVar9 = (ulong)((int)uVar9 + 1);
      }
      if (local_ac < uVar12) {
        local_b4 = (uint)uVar9;
        local_ac = uVar12;
        uVar2 = uVar11;
      }
      uVar13 = uVar13 + 1;
    }
    for (; uVar11 = local_b4, uVar10 < uVar4; uVar10 = uVar10 + 1) {
      sVar5 = FASTCOVER_hashPtrToIndex(ctx->samples + uVar10,f,parameters.d);
      segmentFreqs[sVar5] = segmentFreqs[sVar5] - 1;
    }
    for (; uVar2 != uVar11; uVar11 = uVar11 + 1) {
      sVar5 = FASTCOVER_hashPtrToIndex(ctx->samples + uVar11,f,parameters.d);
      freqs[sVar5] = 0;
    }
    if (local_ac == 0) {
      if (8 < uVar7) break;
      uVar7 = uVar7 + 1;
    }
    else {
      uVar7 = (ulong)((uVar2 + (parameters.d - 1)) - local_b4);
      if (sVar14 < uVar7) {
        uVar7 = sVar14;
      }
      if (uVar7 < parameters.d) break;
      sVar14 = sVar14 - uVar7;
      memcpy((void *)((long)dictBuffer + sVar14),ctx->samples + local_b4,uVar7);
      if ((1 < g_displayLevel) &&
         ((cVar6 = clock(), 150000 < cVar6 - g_time || (3 < g_displayLevel)))) {
        g_time = clock();
        fprintf(_stderr,"\r%u%%       ",
                ((dictBufferCapacity - sVar14) * 100) / dictBufferCapacity & 0xffffffff);
        fflush(_stderr);
      }
      uVar7 = 0;
    }
    uVar8 = (uVar8 + 1) % ((ulong)CVar3 & 0xffffffff);
  }
  if (1 < g_displayLevel) {
    fprintf(_stderr,"\r%79s\r","");
    fflush(_stderr);
  }
  return sVar14;
}

Assistant:

static size_t
FASTCOVER_buildDictionary(const FASTCOVER_ctx_t* ctx,
                          U32* freqs,
                          void* dictBuffer, size_t dictBufferCapacity,
                          ZDICT_cover_params_t parameters,
                          U16* segmentFreqs)
{
  BYTE *const dict = (BYTE *)dictBuffer;
  size_t tail = dictBufferCapacity;
  /* Divide the data into epochs. We will select one segment from each epoch. */
  const COVER_epoch_info_t epochs = COVER_computeEpochs(
      (U32)dictBufferCapacity, (U32)ctx->nbDmers, parameters.k, 1);
  const size_t maxZeroScoreRun = 10;
  size_t zeroScoreRun = 0;
  size_t epoch;
  DISPLAYLEVEL(2, "Breaking content into %u epochs of size %u\n",
                (U32)epochs.num, (U32)epochs.size);
  /* Loop through the epochs until there are no more segments or the dictionary
   * is full.
   */
  for (epoch = 0; tail > 0; epoch = (epoch + 1) % epochs.num) {
    const U32 epochBegin = (U32)(epoch * epochs.size);
    const U32 epochEnd = epochBegin + epochs.size;
    size_t segmentSize;
    /* Select a segment */
    COVER_segment_t segment = FASTCOVER_selectSegment(
        ctx, freqs, epochBegin, epochEnd, parameters, segmentFreqs);

    /* If the segment covers no dmers, then we are out of content.
     * There may be new content in other epochs, for continue for some time.
     */
    if (segment.score == 0) {
      if (++zeroScoreRun >= maxZeroScoreRun) {
          break;
      }
      continue;
    }
    zeroScoreRun = 0;

    /* Trim the segment if necessary and if it is too small then we are done */
    segmentSize = MIN(segment.end - segment.begin + parameters.d - 1, tail);
    if (segmentSize < parameters.d) {
      break;
    }

    /* We fill the dictionary from the back to allow the best segments to be
     * referenced with the smallest offsets.
     */
    tail -= segmentSize;
    memcpy(dict + tail, ctx->samples + segment.begin, segmentSize);
    DISPLAYUPDATE(
        2, "\r%u%%       ",
        (unsigned)(((dictBufferCapacity - tail) * 100) / dictBufferCapacity));
  }
  DISPLAYLEVEL(2, "\r%79s\r", "");
  return tail;
}